

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ShaderAtomicMinCase::getInputs
          (ShaderAtomicMinCase *this,int numValues,int stride,void *inputs)

{
  deUint32 seed;
  int max;
  int iVar1;
  char *str;
  int local_5c;
  int local_40;
  int valNdx;
  int minVal;
  int maxVal;
  bool isSigned;
  Random rnd;
  void *inputs_local;
  int stride_local;
  int numValues_local;
  ShaderAtomicMinCase *this_local;
  
  rnd.m_rnd._8_8_ = inputs;
  str = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(str);
  de::Random::Random((Random *)&maxVal,seed);
  max = 1000;
  if ((this->super_ShaderAtomicOpCase).m_precision == PRECISION_LOWP) {
    max = 100;
  }
  if ((this->super_ShaderAtomicOpCase).m_type == TYPE_INT) {
    local_5c = -max;
  }
  else {
    local_5c = 0;
  }
  for (local_40 = 0; local_40 < numValues; local_40 = local_40 + 1) {
    iVar1 = de::Random::getInt((Random *)&maxVal,local_5c,max);
    *(int *)(rnd.m_rnd._8_8_ + (long)(stride * local_40)) = iVar1;
  }
  de::Random::~Random((Random *)&maxVal);
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random	rnd			(deStringHash(getName()));
		const bool	isSigned	= m_type == TYPE_INT;
		const int	maxVal		= m_precision == PRECISION_LOWP ? 100 : 1000;
		const int	minVal		= isSigned ? -maxVal : 0;

		for (int valNdx = 0; valNdx < numValues; valNdx++)
			*(int*)((deUint8*)inputs + stride*valNdx) = rnd.getInt(minVal, maxVal);
	}